

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mt.cpp
# Opt level: O0

void __thiscall testMt::test_method(testMt *this)

{
  uint local_3a4;
  undefined1 local_3a0 [4];
  uint i;
  text_oarchive oa;
  ostream local_308 [8];
  ofstream ofs;
  System local_108 [8];
  System aSystem;
  testMt *this_local;
  
  dynamicgraph::CPU::System::System(local_108);
  std::ofstream::ofstream(local_308,"cpu_state.dat",0x10);
  boost::archive::text_oarchive::text_oarchive((text_oarchive *)local_3a0,local_308,0);
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator<<
            ((interface_oarchive<boost::archive::text_oarchive> *)local_3a0,local_108);
  for (local_3a4 = 0; local_3a4 < 10; local_3a4 = local_3a4 + 1) {
    usleep(100000);
    dynamicgraph::CPU::System::readProcStat();
  }
  boost::archive::text_oarchive::~text_oarchive((text_oarchive *)local_3a0);
  std::ofstream::~ofstream(local_308);
  dynamicgraph::CPU::System::~System(local_108);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(testMt) {
  dynamicgraph::CPU::System aSystem;

  // create and open a character archive for output
  std::ofstream ofs("cpu_state.dat");
  boost::archive::text_oarchive oa(ofs);
  oa << aSystem;

  for (unsigned int i = 0; i < 10; i++) {
    usleep(100000);
    aSystem.readProcStat();
  }
}